

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cpp *field;
  _Hash_node_base *p_Var2;
  cpp *pcVar3;
  pointer ppFVar4;
  FieldGenerator *pFVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  FieldDescriptor *pFVar9;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  ulong uVar10;
  int iVar11;
  string pod_template;
  string last_field_name;
  string first_field_name;
  Formatter format;
  RunMap runs;
  _Any_data local_130;
  _Manager_type local_120;
  code *local_118;
  string local_110;
  Printer *local_f0;
  vector<bool,_std::allocator<bool>_> *local_e8;
  string local_e0;
  string local_c0;
  Formatter local_a0;
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_f0 = printer;
  local_e8 = processed;
  local_a0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a0.vars_._M_t,&(this->variables_)._M_t);
  local_130._1_7_ = 0;
  local_130._M_pod_data[0] = copy_constructor;
  local_118 = std::
              _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
              ::_M_manager;
  local_130._8_8_ = this;
  anon_unknown_0::FindRuns
            ((RunMap *)&local_68,
             (anon_unknown_0 *)
             (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)(this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
             (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&local_130);
  if (local_120 != (_Manager_type)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  local_130._M_unused._M_object = &local_120;
  local_130._8_8_ = 0;
  local_120 = (_Manager_type)((ulong)local_120 & 0xffffffffffffff00);
  pcVar7 = 
  "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n    reinterpret_cast<char*>(&$first$_) - reinterpret_cast<char*>(this)),\n    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
  ;
  if (copy_constructor) {
    pcVar7 = 
    "::memcpy(&$first$_, &from.$first$_,\n  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,(ulong)pcVar7);
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar10 = 0;
    iVar11 = 0;
    do {
      iVar6 = iVar11 + 0x3f;
      if (-1 < iVar11) {
        iVar6 = iVar11;
      }
      if (((local_e8->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar6 >> 6) +
            (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar10 & 0x3f) & 1) == 0) {
        field = (cpp *)ppFVar4[uVar10];
        pFVar9 = (FieldDescriptor *)((ulong)field % local_68._M_bucket_count);
        if (local_68._M_buckets[(long)pFVar9] != (__node_base_ptr)0x0) {
          p_Var2 = local_68._M_buckets[(long)pFVar9]->_M_nxt;
          pcVar3 = (cpp *)p_Var2[1]._M_nxt;
          field_00 = pFVar9;
          do {
            if (field == pcVar3) {
              p_Var2 = p_Var2[2]._M_nxt;
              if ((_Hash_node_base *)0x1 < p_Var2) {
                FieldName_abi_cxx11_(&local_c0,field,field_00);
                FieldName_abi_cxx11_
                          (&local_e0,
                           (cpp *)(this->optimized_order_).
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)p_Var2 + (uVar10 - 1)],field_01);
                paVar1 = &local_110.field_2;
                local_110._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"first","");
                Formatter::Set<std::__cxx11::string>(&local_a0,&local_110,&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != paVar1) {
                  operator_delete(local_110._M_dataplus._M_p);
                }
                local_110._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"last","");
                Formatter::Set<std::__cxx11::string>(&local_a0,&local_110,&local_e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != paVar1) {
                  operator_delete(local_110._M_dataplus._M_p);
                }
                Formatter::operator()<>(&local_a0,(char *)local_130._M_unused._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                iVar11 = iVar11 + (int)p_Var2 + -1;
                goto LAB_002ab2dc;
              }
              break;
            }
            p_Var2 = p_Var2->_M_nxt;
            if (p_Var2 == (_Hash_node_base *)0x0) break;
            pcVar3 = (cpp *)p_Var2[1]._M_nxt;
            field_00 = (FieldDescriptor *)((ulong)pcVar3 % local_68._M_bucket_count);
          } while (field_00 == pFVar9);
        }
        if (copy_constructor) {
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)field);
          lVar8 = 0x68;
        }
        else {
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)field);
          lVar8 = 0x78;
        }
        (**(code **)((long)pFVar5->_vptr_FieldGenerator + lVar8))(pFVar5,local_f0);
      }
LAB_002ab2dc:
      iVar11 = iVar11 + 1;
      uVar10 = (ulong)iVar11;
      ppFVar4 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  if ((_Manager_type *)local_130._M_unused._0_8_ != &local_120) {
    operator_delete(local_130._M_unused._M_object);
  }
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  Formatter format(printer, variables_);

  const RunMap runs = FindRuns(
      optimized_order_, [copy_constructor, this](const FieldDescriptor* field) {
        return (copy_constructor && IsPOD(field)) ||
               (!copy_constructor &&
                CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_));
      });

  std::string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n"
        "    reinterpret_cast<char*>(&$first$_) - "
        "reinterpret_cast<char*>(this)),\n"
        "    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    const auto it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const std::string first_field_name = FieldName(field);
      const std::string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      format.Set("first", first_field_name);
      format.Set("last", last_field_name);

      format(pod_template.c_str());

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}